

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fullsearch.cpp
# Opt level: O0

int __thiscall FullSearch::search(FullSearch *this,Board *board)

{
  bool bVar1;
  reference pPVar2;
  int local_104;
  int value;
  undefined1 local_e8 [8];
  Board tmpBoard;
  Position choose;
  iterator __end1;
  iterator __begin1;
  vector<Position,_std::allocator<Position>_> *__range1;
  vector<Position,_std::allocator<Position>_> possibleChoose;
  undefined1 local_50 [6];
  bool isAbleToWin;
  bool isAbleToTie;
  int local_28;
  int local_24;
  int blackNum;
  int whiteNum;
  Board *board_local;
  FullSearch *this_local;
  
  _blackNum = board;
  board_local = (Board *)this;
  if ((board->gameEnd & 1U) != 0) {
    Board::countBoard((Board *)&stack0xffffffffffffffcc);
    std::tie<std::_Swallow_assign_const,int,int>
              ((tuple<const_std::_Swallow_assign_&,_int_&,_int_&> *)local_50,
               (_Swallow_assign *)&std::ignore,&stack0xffffffffffffffdc,&stack0xffffffffffffffd8);
    std::tuple<std::_Swallow_assign_const&,int&,int&>::operator=
              ((tuple<std::_Swallow_assign_const&,int&,int&> *)local_50,
               (tuple<bool,_int,_int> *)&stack0xffffffffffffffcc);
    if (local_24 == local_28) {
      return 0;
    }
    if (_blackNum->nowPlayer == 1) {
      if (local_28 <= local_24) {
        return -1;
      }
      return 1;
    }
    if (_blackNum->nowPlayer == 0) {
      if (local_24 <= local_28) {
        return -1;
      }
      return 1;
    }
  }
  possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  Board::findPossibleChoose((vector<Position,_std::allocator<Position>_> *)&__range1,_blackNum);
  __end1 = std::vector<Position,_std::allocator<Position>_>::begin
                     ((vector<Position,_std::allocator<Position>_> *)&__range1);
  choose = (Position)
           std::vector<Position,_std::allocator<Position>_>::end
                     ((vector<Position,_std::allocator<Position>_> *)&__range1);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Position_*,_std::vector<Position,_std::allocator<Position>_>_>
                                *)&choose);
    if (!bVar1) {
LAB_0010d12b:
      if ((possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
        if ((possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          this_local._4_4_ = -1;
        }
        else {
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = 1;
      }
      std::vector<Position,_std::allocator<Position>_>::~vector
                ((vector<Position,_std::allocator<Position>_> *)&__range1);
      return this_local._4_4_;
    }
    pPVar2 = __gnu_cxx::
             __normal_iterator<Position_*,_std::vector<Position,_std::allocator<Position>_>_>::
             operator*(&__end1);
    tmpBoard._80_8_ = *pPVar2;
    Board::Board((Board *)local_e8,_blackNum);
    Board::doChoose((Board *)local_e8,(Position)tmpBoard._80_8_);
    local_104 = search(this,(Board *)local_e8);
    if (tmpBoard.used._4_4_ != _blackNum->nowPlayer) {
      if (local_104 == -1) {
        local_104 = 1;
      }
      else if (local_104 == 0) {
        local_104 = 0;
      }
      else if (local_104 == 1) {
        local_104 = -1;
      }
    }
    if (local_104 == 1) {
      possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      goto LAB_0010d12b;
    }
    if (local_104 == 0) {
      possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    __gnu_cxx::__normal_iterator<Position_*,_std::vector<Position,_std::allocator<Position>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

int FullSearch::search(Board &board) {
    if (board.gameEnd) {
        int whiteNum,blackNum;
        tie(ignore, whiteNum, blackNum) = board.countBoard();
        if (whiteNum == blackNum) {
            return TIE;
        }
        if (board.nowPlayer == Board::BLACK) {
            return blackNum > whiteNum ? WIN : LOST;
        }
        if (board.nowPlayer == Board::WHITE) {
            return blackNum < whiteNum ? WIN : LOST;
        }
    }
    bool isAbleToTie = false;
    bool isAbleToWin = false;

    vector<Position> possibleChoose = board.findPossibleChoose();
    for (Position choose : possibleChoose) {
        Board tmpBoard = board;
        tmpBoard.doChoose(choose);
        int value = search(tmpBoard);

        //这里胜负正好相反，下一手赢了，说明当前手输了。
        if (tmpBoard.nowPlayer != board.nowPlayer) {
            switch (value) {
                case WIN:
                    value = LOST;
                    break;
                case LOST:
                    value = WIN;
                    break;
                case TIE:
                    value = TIE;
                    break;
            }
        }
        // if(board.nowPlayer == Board::WHITE){
        //     printf("%d\n", value);
        // }

        if (value == WIN) {
            isAbleToWin = true;
            //已经找到赢的路了，剪枝
            break;
        } else if (value == TIE) {
            isAbleToTie = true;
        }
    }
    if (isAbleToWin) {
        return WIN;
    } else if (isAbleToTie) {
        return TIE;
    } else {
        return LOST;
    }
}